

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O2

void createVars(vec<IntVar_*> *x,int n,int min,int max,bool el)

{
  IntVar *pIVar1;
  ulong uVar2;
  ulong uVar3;
  
  vec<IntVar_*>::growTo(x,n);
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pIVar1 = newIntVar(min,max);
    x->data[uVar2] = pIVar1;
    if (el) {
      IntVar::specialiseToEL(x->data[uVar2]);
    }
  }
  return;
}

Assistant:

void createVars(vec<IntVar*>& x, int n, int min, int max, bool el) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i] = newIntVar(min, max);
		if (el) {
			x[i]->specialiseToEL();
		}
	}
}